

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O1

shared_ptr<const_void> __thiscall pstore::storage::segment_base(storage *this,segment_type segment)

{
  long lVar1;
  _Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false> _Var2;
  long lVar3;
  element_type *peVar4;
  int in_EDX;
  ulong uVar5;
  undefined6 in_register_00000032;
  shared_ptr<const_void> sVar6;
  
  lVar1 = *(long *)CONCAT62(in_register_00000032,segment);
  sVar6.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
       in_EDX << 5;
  uVar5 = (ulong)(uint)sVar6.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi;
  _Var2._M_head_impl = *(array<pstore::sat_entry,_65536UL> **)(lVar1 + uVar5);
  lVar3 = *(long *)(lVar1 + 0x10 + uVar5);
  if ((_Var2._M_head_impl != (array<pstore::sat_entry,_65536UL> *)0x0 || lVar3 != 0) &&
     ((_Var2._M_head_impl < *(array<pstore::sat_entry,_65536UL> **)(lVar3 + 8) ||
      ((array<pstore::sat_entry,_65536UL> *)
       ((long)&(*(array<pstore::sat_entry,_65536UL> **)(lVar3 + 8))->_M_elems[0].value.
               super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> + *(long *)(lVar3 + 0x28)) <
       _Var2._M_head_impl + 2)))) {
    assert_failed("e.is_valid ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/storage.hpp"
                  ,0x109);
  }
  (this->sat_)._M_t.
  super___uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
  .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl =
       _Var2._M_head_impl;
  peVar4 = *(element_type **)(lVar1 + uVar5 + 8);
  (this->file_).super___shared_ptr<pstore::file::file_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar4;
  if (peVar4 != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&peVar4[1]._vptr_file_base = *(int *)&peVar4[1]._vptr_file_base + 1;
      UNLOCK();
    }
    else {
      *(int *)&peVar4[1]._vptr_file_base = *(int *)&peVar4[1]._vptr_file_base + 1;
    }
  }
  sVar6.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  sVar6.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 0;
  return (shared_ptr<const_void>)sVar6.super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<void const>
        segment_base (address::segment_type const segment) const noexcept {
            return segment_base_impl (*this, segment);
        }